

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

void __thiscall Snake::move(Snake *this)

{
  bool bVar1;
  Point in_RAX;
  Body *this_00;
  __normal_iterator<Object_**,_std::vector<Object_*,_std::allocator<Object_*>_>_> __tmp;
  pointer ppOVar2;
  Point local_18;
  
  local_18 = in_RAX;
  bVar1 = Head::want_tail(this->head);
  if (bVar1) {
    this->points = this->points + 1;
    this_00 = (Body *)operator_new(0x28);
    local_18.x = 0;
    local_18.y = 0;
    Body::Body(this_00,&local_18,this->tail);
    this->tail = (PObject)this_00;
    std::vector<Object_*,_std::allocator<Object_*>_>::push_back(&this->body,&this->tail);
    Head::give_tail(this->head,false);
  }
  for (ppOVar2 = (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppOVar2 !=
      (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_start; ppOVar2 = ppOVar2 + -1) {
    (**ppOVar2[-1]->_vptr_Object)();
  }
  return;
}

Assistant:

void Snake::move(){
	if (head->want_tail()){
		points++;
		PObject temp = new Body(Point(), tail);
		tail = temp;
		body.push_back(tail);
		head->give_tail(false);
	}
	for (vector<PObject>::reverse_iterator i = body.rbegin(); i != body.rend(); i++){
		(*i)->move();
	}
}